

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

int SimpleLoggerMgr::getTzGap(void)

{
  tm *src;
  tm *src_00;
  time_t raw_time;
  TimeInfo gmt;
  TimeInfo lt;
  tm new_time;
  long local_98;
  TimeInfo local_90;
  TimeInfo local_70;
  tm local_50;
  
  local_98 = std::chrono::_V2::system_clock::now();
  local_98 = local_98 / 1000000000;
  src = localtime_r(&local_98,&local_50);
  src_00 = gmtime(&local_98);
  TimeInfo::TimeInfo(&local_70,(tm *)src);
  TimeInfo::TimeInfo(&local_90,(tm *)src_00);
  return (local_70.min - local_90.min) + (local_70.day - local_90.day) * 0x5a0 +
         (local_70.hour - local_90.hour) * 0x3c;
}

Assistant:

int SimpleLoggerMgr::getTzGap() {
    std::chrono::system_clock::time_point now =
        std::chrono::system_clock::now();
    std::time_t raw_time = std::chrono::system_clock::to_time_t(now);
    std::tm new_time;

#if defined(__linux__) || defined(__APPLE__)
    std::tm* lt_tm = localtime_r(&raw_time, &new_time);
    std::tm* gmt_tm = std::gmtime(&raw_time);

#elif defined(WIN32) || defined(_WIN32)
    localtime_s(&new_time, &raw_time);
    std::tm* lt_tm = &new_time;
    std::tm new_gmt_time;
    gmtime_s(&new_gmt_time, &raw_time);
    std::tm* gmt_tm = &new_gmt_time;
#endif

    TimeInfo lt(lt_tm);
    TimeInfo gmt(gmt_tm);

    return ( (  lt.day * 60 * 24 +  lt.hour * 60 +  lt.min ) -
             ( gmt.day * 60 * 24 + gmt.hour * 60 + gmt.min ) );
}